

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O2

stream * opentempfile(char *name,char *mode)

{
  bool bVar1;
  char *name_00;
  filestream *this;
  
  name_00 = findfile(name,mode);
  this = (filestream *)operator_new(0x10);
  (this->super_stream)._vptr_stream = (_func_int **)&PTR__filestream_0017fb28;
  this->file = (FILE *)0x0;
  if (name_00 == (char *)0x0) {
    name_00 = name;
  }
  bVar1 = filestream::opentemp(this,name_00,mode);
  if (!bVar1) {
    (*(this->super_stream)._vptr_stream[1])(this);
    this = (filestream *)0x0;
  }
  return &this->super_stream;
}

Assistant:

stream *opentempfile(const char *name, const char *mode)
{
    const char *found = findfile(name, mode);
    filestream *file = new filestream;
    if(!file->opentemp(found ? found : name, mode)) { delete file; return NULL; }
    return file;
}